

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O0

bool XmlRpc::XmlRpcUtil::nextTagIs(char *tag,string *xml,int *offset)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  int *in_RDX;
  char *in_RDI;
  bool bVar5;
  int len;
  int nc;
  char *cp;
  int local_2c;
  char *local_28;
  
  iVar2 = *in_RDX;
  iVar1 = std::__cxx11::string::length();
  if (iVar2 < iVar1) {
    lVar3 = std::__cxx11::string::c_str();
    local_28 = (char *)(lVar3 + *in_RDX);
    local_2c = 0;
    while( true ) {
      bVar5 = false;
      if (*local_28 != '\0') {
        iVar2 = isspace((int)*local_28);
        bVar5 = iVar2 != 0;
      }
      if (!bVar5) break;
      local_28 = local_28 + 1;
      local_2c = local_2c + 1;
    }
    sVar4 = strlen(in_RDI);
    if ((*local_28 != '\0') && (iVar2 = strncmp(local_28,in_RDI,(long)(int)sVar4), iVar2 == 0)) {
      *in_RDX = local_2c + (int)sVar4 + *in_RDX;
      return true;
    }
  }
  return false;
}

Assistant:

bool 
XmlRpcUtil::nextTagIs(const char* tag, std::string const& xml, int* offset)
{
  if (*offset >= int(xml.length())) return false;
  const char* cp = xml.c_str() + *offset;
  int nc = 0;
  while (*cp && isspace(*cp)) {
    ++cp;
    ++nc;
  }

  int len = int(strlen(tag));
  if  (*cp && (strncmp(cp, tag, len) == 0)) {
    *offset += nc + len;
    return true;
  }
  return false;
}